

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O1

BigNumber * __thiscall
BigNumber::addll(BigNumber *__return_storage_ptr__,BigNumber *this,longlong *other)

{
  BigNumber local_38;
  
  BigNumber(&local_38,*other);
  add(__return_storage_ptr__,this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._numberString._M_dataplus._M_p != &local_38._numberString.field_2) {
    operator_delete(local_38._numberString._M_dataplus._M_p,
                    local_38._numberString.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber::addll(const long long &other) {
    return this->add(BigNumber(other));
}